

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O1

void __thiscall dynamicgraph::TracerRealTime::display(TracerRealTime *this,ostream *os)

{
  ulong uVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  sbyte sVar7;
  long *plVar8;
  long *plVar9;
  string unit;
  long *local_68;
  char *local_60;
  long local_58 [2];
  undefined1 *local_48;
  undefined8 local_40;
  long *local_38;
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,CLASS_NAME_abi_cxx11_._M_dataplus._M_p,
                      CLASS_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)&this->field_0x8,*(long *)&this->field_0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," [mode=",7);
  pcVar6 = "pause";
  if ((ulong)(byte)this->field_0x1c0 != 0) {
    pcVar6 = "play";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,pcVar6,(ulong)(byte)this->field_0x1c0 ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] : ",4);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  - Dep list: ",0xe);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_48 = &this->field_0xd8;
  plVar9 = *(long **)&this->field_0xd8;
  if ((long *)local_48 != plVar9) {
    plVar8 = (long *)&this->field_0x190;
    do {
      plVar8 = (long *)*plVar8;
      if (plVar8[2] == 0) {
        lVar5 = 0;
      }
      else {
        lVar5 = __dynamic_cast(plVar8[2],&std::ostream::typeinfo,&OutStringStream::typeinfo,0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"     -> ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,*(char **)(plVar9[2] + 8),*(long *)(plVar9[2] + 0x10));
      if (*(long *)(lVar5 + 0x98) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os," (in ",5);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,*(char **)(lVar5 + 0x90),*(long *)(lVar5 + 0x98));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
      if (lVar5 != 0) {
        local_40 = *(undefined8 *)(&os->field_0x8 + (long)os->_vptr_basic_ostream[-3]);
        uVar1 = *(ulong *)(lVar5 + 0x78);
        uVar2 = *(ulong *)(lVar5 + 0x80);
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68);
        local_38 = plVar8;
        if (uVar1 < 0x40000000 && uVar2 < 0x40000000) {
          if (uVar1 < 0x100000 && uVar2 < 0x100000) {
            sVar7 = 0;
            if (0x3ff < uVar1 || 0x3ff < uVar2) {
              sVar7 = 10;
              std::__cxx11::string::_M_replace((ulong)&local_68,0,local_60,0x10e12a);
            }
          }
          else {
            sVar7 = 0x14;
            std::__cxx11::string::_M_replace((ulong)&local_68,0,local_60,0x10e127);
          }
        }
        else {
          sVar7 = 0x1e;
          std::__cxx11::string::_M_replace((ulong)&local_68,0,local_60,0x10e124);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
        pp_Var3 = os->_vptr_basic_ostream;
        *(undefined8 *)(&os->field_0x10 + (long)pp_Var3[-3]) = 1;
        *(undefined8 *)(&os->field_0x8 + (long)pp_Var3[-3]) = 1;
        poVar4 = std::ostream::_M_insert<double>((double)(long)uVar1 / (double)(1 << sVar7));
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_68,(long)local_60);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
        *(undefined8 *)(&poVar4->field_0x8 + (long)poVar4->_vptr_basic_ostream[-3]) = 2;
        poVar4 = std::ostream::_M_insert<double>((double)(long)uVar2 / (double)(1 << sVar7));
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_68,(long)local_60);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\t",2);
        if (*(char *)(lVar5 + 0x88) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>(os,"(FULL)",6);
        }
        plVar8 = local_38;
        *(undefined8 *)(&os->field_0x8 + (long)os->_vptr_basic_ostream[-3]) = local_40;
        if (local_68 != local_58) {
          operator_delete(local_68,local_58[0] + 1);
        }
      }
      std::ios::widen((char)os->_vptr_basic_ostream[-3] + (char)os);
      std::ostream::put((char)os);
      std::ostream::flush();
      plVar9 = (long *)*plVar9;
    } while ((long *)local_48 != plVar9);
  }
  return;
}

Assistant:

void TracerRealTime::display(std::ostream &os) const {
  os << CLASS_NAME << " " << name << " [mode=" << (play ? "play" : "pause")
     << "] : " << endl
     << "  - Dep list: " << endl;

  FileList::const_iterator iterFile = files.begin();
  for (SignalList::const_iterator iter = toTraceSignals.begin();
       toTraceSignals.end() != iter; ++iter) {
    dgDEBUG(35) << "Next" << endl;
    const OutStringStream *file = dynamic_cast<OutStringStream *>(*iterFile);
    os << "     -> " << (*iter)->getName();
    if (file->givenname.length()) os << " (in " << file->givenname << ")";
    os << "\t";
    if (file) {
      const std::streamsize PRECISION = os.precision();
      const std::streamsize SIZE = file->index;
      const std::streamsize MSIZE = file->bufferSize;
      unsigned int dec = 0;
      std::string unit = "";
      if ((SIZE >> 30) || (MSIZE >> 30)) {
        dec = 30;
        unit = "Go";
      } else if ((SIZE >> 20) || (MSIZE >> 20)) {
        dec = 20;
        unit = "Mo";
      } else if ((SIZE >> 10) || (MSIZE >> 10)) {
        dec = 10;
        unit = "Ko";
      }
      os << "[" << std::setw(1) << std::setprecision(1)
         << (((double)SIZE + 0.0) / (1 << dec)) << unit << "/"
         << std::setprecision(2) << (((double)MSIZE + 0.0) / (1 << dec)) << unit
         << "]\t";
      if (file->full) os << "(FULL)";
      os.precision(PRECISION);
    }
    os << endl;
    ++iterFile;
  }
}